

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BaseCase::verifyMessage
          (BaseCase *this,MessageData *message,GLenum source,GLenum type,GLuint id,GLenum severity)

{
  bool bVar1;
  MessageBuilder *pMVar2;
  Enum<int,_2UL> EVar3;
  Enum<int,_2UL> local_3c0;
  GetNameFunc local_3b0;
  int local_3a8;
  Enum<int,_2UL> local_3a0;
  MessageBuilder local_390;
  allocator<char> local_209;
  string local_208;
  MessageBuilder local_1e8;
  allocator<char> local_51;
  string local_50;
  TestLog *local_30;
  TestLog *log;
  GLenum severity_local;
  GLuint id_local;
  GLenum type_local;
  GLenum source_local;
  MessageData *message_local;
  BaseCase *this_local;
  
  log._0_4_ = severity;
  log._4_4_ = id;
  severity_local = type;
  id_local = source;
  _type_local = message;
  message_local = (MessageData *)this;
  local_30 = tcu::TestContext::getLog
                       ((this->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
  bVar1 = verifyMessageExists(this,_type_local,id_local,severity_local);
  if (bVar1) {
    verifyMessageString(this,_type_local);
    verifyMessageGroup(this,_type_local,id_local,severity_local);
    if ((_type_local->id).id != log._4_4_) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Incorrect message id",&local_51);
      tcu::ResultCollector::addResult(&this->m_results,QP_TEST_RESULT_FAIL,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      tcu::TestLog::operator<<(&local_1e8,local_30,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar2 = tcu::MessageBuilder::operator<<(&local_1e8,(char (*) [16])"Message id was ");
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&(_type_local->id).id);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [27])" when it should have been ");
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)((long)&log + 4));
      tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1e8);
    }
    if (_type_local->severity != (GLenum)log) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"Incorrect message severity",&local_209);
      tcu::ResultCollector::addResult(&this->m_results,QP_TEST_RESULT_FAIL,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator(&local_209);
      tcu::TestLog::operator<<(&local_390,local_30,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar2 = tcu::MessageBuilder::operator<<(&local_390,(char (*) [22])"Message severity was ");
      EVar3 = glu::getDebugMessageSeverityStr(_type_local->severity);
      local_3b0 = EVar3.m_getName;
      local_3a8 = EVar3.m_value;
      local_3a0.m_getName = local_3b0;
      local_3a0.m_value = local_3a8;
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_3a0);
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [27])" when it should have been ");
      EVar3 = glu::getDebugMessageSeverityStr((GLenum)log);
      local_3c0.m_getName = EVar3.m_getName;
      local_3c0.m_value = EVar3.m_value;
      pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_3c0);
      tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_390);
    }
  }
  return;
}

Assistant:

void BaseCase::verifyMessage (const MessageData& message, GLenum source, GLenum type, GLuint id, GLenum severity)
{
	TestLog& log = m_testCtx.getLog();

	if (verifyMessageExists(message, source, type))
	{
		verifyMessageString(message);
		verifyMessageGroup(message, source, type);

		if (message.id.id != id)
		{
			m_results.addResult(QP_TEST_RESULT_FAIL, "Incorrect message id");
			log << TestLog::Message << "Message id was " << message.id.id
				<< " when it should have been " << id << TestLog::EndMessage;
		}

		if (message.severity != severity)
		{
			m_results.addResult(QP_TEST_RESULT_FAIL, "Incorrect message severity");
			log << TestLog::Message << "Message severity was " << glu::getDebugMessageSeverityStr(message.severity)
				<< " when it should have been " << glu::getDebugMessageSeverityStr(severity) << TestLog::EndMessage;
		}
	}
}